

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
__thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,size_t depth)

{
  value_type puVar1;
  uchar uVar2;
  byte bVar3;
  uint uVar4;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this_00;
  size_type sVar5;
  const_reference ppuVar6;
  reference ppuVar7;
  reference pvVar8;
  byte *pbVar9;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar10;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *sub_bucket_1;
  uchar *puStack_2a0;
  uchar ch_1;
  uchar *ptr;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *sub_bucket;
  uint local_288;
  uint uStack_284;
  uchar ch;
  uint j_1;
  uint j;
  array<unsigned_char_*,_64UL> strings;
  array<unsigned_char,_64UL> cache;
  uint i;
  uint bucket_size;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *new_node
  ;
  size_t depth_local;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_local;
  BurstSimple<unsigned_char> *this_local;
  
  this_00 = (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
             *)operator_new(0x18);
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::TrieNode
            (this_00);
  sVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket);
  uVar4 = (uint)sVar5;
  cache._M_elems[0x38] = '\0';
  cache._M_elems[0x39] = '\0';
  cache._M_elems[0x3a] = '\0';
  cache._M_elems[0x3b] = '\0';
  do {
    if (uVar4 - (uVar4 & 0x3f) <= (uint)cache._M_elems._56_4_) {
      while( true ) {
        if (uVar4 <= (uint)cache._M_elems._56_4_) {
          return this_00;
        }
        ppuVar6 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                            (bucket,(ulong)(uint)cache._M_elems._56_4_);
        puStack_2a0 = *ppuVar6;
        bVar3 = get_char<unsigned_char>(puStack_2a0,depth);
        pvVar10 = TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                  ::get_bucket(this_00,(uint)bVar3);
        if (pvVar10 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) break;
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                  (pvVar10,&stack0xfffffffffffffd60);
        cache._M_elems._56_4_ = cache._M_elems._56_4_ + 1;
      }
      __assert_fail("sub_bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0x80,
                    "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = std::vector<unsigned char *>]"
                   );
    }
    for (uStack_284 = 0; uStack_284 < 0x40; uStack_284 = uStack_284 + 1) {
      ppuVar6 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          (bucket,(ulong)(cache._M_elems._56_4_ + uStack_284));
      puVar1 = *ppuVar6;
      ppuVar7 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_284);
      *ppuVar7 = puVar1;
      ppuVar7 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_284);
      uVar2 = get_char<unsigned_char>(*ppuVar7,depth);
      pvVar8 = std::array<unsigned_char,_64UL>::operator[]
                         ((array<unsigned_char,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)uStack_284);
      *pvVar8 = uVar2;
    }
    for (local_288 = 0; local_288 < 0x40; local_288 = local_288 + 1) {
      pbVar9 = std::array<unsigned_char,_64UL>::operator[]
                         ((array<unsigned_char,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)local_288);
      sub_bucket._7_1_ = *pbVar9;
      pvVar10 = TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                ::get_bucket(this_00,(uint)sub_bucket._7_1_);
      ptr = (uchar *)pvVar10;
      if (pvVar10 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x78,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = std::vector<unsigned char *>]"
                     );
      }
      ppuVar7 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)local_288);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(pvVar10,ppuVar7);
    }
    cache._M_elems._56_4_ = cache._M_elems._56_4_ + 0x40;
  } while( true );
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}